

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cIncompleteTextureAccessTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::IncompleteTextureAccess::SamplerTest::iterate(SamplerTest *this)

{
  Configuration configuration;
  Configuration configuration_00;
  Configuration configuration_01;
  bool bVar1;
  RenderContext *pRVar2;
  ulong uVar3;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar4;
  MessageBuilder local_248;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  uint local_38;
  GLuint i;
  byte local_26;
  byte local_25;
  deUint32 local_24;
  bool is_error;
  ApiType AStack_20;
  bool is_ok;
  undefined1 local_19;
  SamplerTest *pSStack_18;
  bool is_at_least_gl_45;
  SamplerTest *this_local;
  
  pSStack_18 = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  AStack_20.m_bits = (*pRVar2->_vptr_RenderContext[2])();
  local_24 = (deUint32)glu::ApiType::core(4,5);
  local_19 = glu::contextSupports((ContextType)AStack_20.m_bits,(ApiType)local_24);
  if ((bool)local_19) {
    local_25 = 1;
    local_26 = 0;
    PrepareFramebuffer(this);
    PrepareVertexArrays(this);
    for (local_38 = 0; local_38 < 0xf; local_38 = local_38 + 1) {
      uVar3 = (ulong)local_38;
      local_48 = *(undefined8 *)(s_configurations + uVar3 * 0x28 + 0x20);
      local_68 = *(undefined8 *)*(undefined1 (*) [16])(s_configurations + uVar3 * 0x28);
      uStack_60 = *(undefined8 *)(s_configurations + uVar3 * 0x28 + 8);
      local_58 = *(undefined8 *)(s_configurations + uVar3 * 0x28 + 0x10);
      uStack_50 = *(undefined8 *)(s_configurations + uVar3 * 0x28 + 0x18);
      configuration.fetch_template = (GLchar *)local_58;
      configuration._0_16_ = *(undefined1 (*) [16])(s_configurations + uVar3 * 0x28);
      configuration.expected_result[0] = (GLfloat)(int)uStack_50;
      configuration.expected_result[1] = (GLfloat)(int)((ulong)uStack_50 >> 0x20);
      configuration.expected_result[2] = (GLfloat)(int)local_48;
      configuration.expected_result[3] = (GLfloat)(int)((ulong)local_48 >> 0x20);
      PrepareProgram(this,configuration);
      uVar3 = (ulong)local_38;
      local_78 = *(undefined8 *)(s_configurations + uVar3 * 0x28 + 0x20);
      local_98 = *(undefined8 *)*(undefined1 (*) [16])(s_configurations + uVar3 * 0x28);
      uStack_90 = *(undefined8 *)(s_configurations + uVar3 * 0x28 + 8);
      local_88 = *(undefined8 *)(s_configurations + uVar3 * 0x28 + 0x10);
      uStack_80 = *(undefined8 *)(s_configurations + uVar3 * 0x28 + 0x18);
      configuration_00.fetch_template = (GLchar *)local_88;
      configuration_00._0_16_ = *(undefined1 (*) [16])(s_configurations + uVar3 * 0x28);
      configuration_00.expected_result[0] = (GLfloat)(int)uStack_80;
      configuration_00.expected_result[1] = (GLfloat)(int)((ulong)uStack_80 >> 0x20);
      configuration_00.expected_result[2] = (GLfloat)(int)local_78;
      configuration_00.expected_result[3] = (GLfloat)(int)((ulong)local_78 >> 0x20);
      PrepareTexture(this,configuration_00);
      Draw(this);
      uVar3 = (ulong)local_38;
      local_a8 = *(undefined8 *)(s_configurations + uVar3 * 0x28 + 0x20);
      local_c8 = *(undefined8 *)*(undefined1 (*) [16])(s_configurations + uVar3 * 0x28);
      uStack_c0 = *(undefined8 *)(s_configurations + uVar3 * 0x28 + 8);
      local_b8 = *(undefined8 *)(s_configurations + uVar3 * 0x28 + 0x10);
      uStack_b0 = *(undefined8 *)(s_configurations + uVar3 * 0x28 + 0x18);
      configuration_01.fetch_template = (GLchar *)local_b8;
      configuration_01._0_16_ = *(undefined1 (*) [16])(s_configurations + uVar3 * 0x28);
      configuration_01.expected_result[0] = (GLfloat)(int)uStack_b0;
      configuration_01.expected_result[1] = (GLfloat)(int)((ulong)uStack_b0 >> 0x20);
      configuration_01.expected_result[2] = (GLfloat)(int)local_a8;
      configuration_01.expected_result[3] = (GLfloat)(int)((ulong)local_a8 >> 0x20);
      bVar1 = Check(this,configuration_01);
      if (!bVar1) {
        this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        this_01 = tcu::TestContext::getLog(this_00);
        tcu::TestLog::operator<<(&local_248,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (&local_248,
                            (char (*) [60])
                            "Incomplete texture sampler access test failed with sampler ");
        pMVar4 = tcu::MessageBuilder::operator<<
                           (pMVar4,(char **)(s_configurations + (ulong)local_38 * 0x28 + 8));
        pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2b5e49a);
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_248);
        local_25 = 0;
      }
      CleanCase(this);
    }
    CleanCase(this);
    CleanTest(this);
    if ((local_25 & 1) == 0) {
      if ((local_26 & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_INTERNAL_ERROR,"Error");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult SamplerTest::iterate()
{
	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));

	if (!is_at_least_gl_45)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		PrepareFramebuffer();
		PrepareVertexArrays();

		for (glw::GLuint i = 0; i < s_configurations_count; ++i)
		{
			PrepareProgram(s_configurations[i]);
			PrepareTexture(s_configurations[i]);

			Draw();

			if (!Check(s_configurations[i]))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Incomplete texture sampler access test failed with sampler "
					<< s_configurations[i].sampler_template << "." << tcu::TestLog::EndMessage;

				is_ok = false;
			}

			CleanCase();
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	CleanCase();
	CleanTest();

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}